

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void pzshape::TPZShapeDisc::Shape1D
               (REAL C,TPZVec<double> *X0,TPZVec<double> *X,int degree,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  (*(code *)fOrthogonal)(C,*X0->fStore,*X->fStore,degree,phi,dphi,1,dphi,fOrthogonal);
  return;
}

Assistant:

T& operator[]( const int64_t index ) const
	{
#ifdef PZDEBUG
		if( index < 0 || index >= fNElements )
		{
            PZError << __PRETTY_FUNCTION__ << " acessing element out of range.";
            PZError << "|" << std::endl;
            PZError << "+-> NElements = " << NElements() << std::endl;
            PZError << "|" << std::endl;
            PZError << "+-> Index = " << index << std::endl;
            DebugStop();
            exit( -1 );
		}
#endif
		return fStore[ index ];
	}